

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O0

wstring * GdlFeatureDefn::GetLabelFromNameTable_abi_cxx11_(int nNameID,int nLangID,uint8 *pNameTbl)

{
  undefined1 uVar1;
  undefined2 *n;
  ulong uVar2;
  void *pvVar3;
  wstring *in_RDI;
  int i;
  wchar_t *pchwName32;
  utf16 *pchwSrcName;
  utf16 *pchwName;
  size_t cchw;
  size_t lSize;
  size_t lOffset;
  wstring *stuName;
  size_t *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  wstring *pNameTblArg;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar4;
  size_t *in_stack_ffffffffffffffa0;
  
  pNameTblArg = in_RDI;
  std::__cxx11::wstring::wstring(in_RDI);
  std::__cxx11::wstring::erase((ulong)pNameTblArg,0);
  uVar1 = TtfUtil::GetNameInfo
                    (pNameTblArg,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                     CONCAT13(in_stack_ffffffffffffff7f,
                              CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)),
                     in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffffa0);
  if (((bool)uVar1) ||
     (in_stack_ffffffffffffff7e =
           TtfUtil::GetNameInfo
                     (pNameTblArg,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                      CONCAT13(uVar1,CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)),
                      in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffffa0)
     , (bool)in_stack_ffffffffffffff7e)) {
    n = (undefined2 *)operator_new__(2);
    gr::utf16ncpy((utf16 *)in_RDI,
                  (utf16 *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff7e,
                                                   CONCAT24(in_stack_ffffffffffffff7c,
                                                            in_stack_ffffffffffffff78))),(size_t)n);
    TtfUtil::SwapWString
              ((void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (size_t)pNameTblArg);
    *n = 0;
    uVar2 = SUB168(ZEXT816(1) * ZEXT816(4),0);
    if (SUB168(ZEXT816(1) * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    for (iVar4 = 0; iVar4 < 1; iVar4 = iVar4 + 1) {
      *(uint *)((long)pvVar3 + (long)iVar4 * 4) = (uint)(ushort)n[iVar4];
    }
    std::__cxx11::wstring::assign((wchar_t *)pNameTblArg,(ulong)pvVar3);
    if (pvVar3 != (void *)0x0) {
      operator_delete__(pvVar3);
    }
  }
  return in_RDI;
}

Assistant:

std::wstring GdlFeatureDefn::GetLabelFromNameTable(int nNameID, int nLangID, uint8 * pNameTbl)
{
	std::wstring stuName;
	stuName.erase();
	size_t lOffset = 0;
	size_t lSize = 0;

	// The Graphite compiler stores our names in either 
	// the MS (platform id = 3) Unicode (writing system id = 1) table
	// or the MS Symbol (writing system id = 0) table. Try MS Unicode first.
	// lOffset & lSize are in bytes.
	// new interface:
	if (!TtfUtil::GetNameInfo(pNameTbl, 3, 1, nLangID, nNameID, lOffset, lSize))
	{
		if (!TtfUtil::GetNameInfo(pNameTbl, 3, 0, nLangID, nNameID, lOffset, lSize))
		{
			return stuName;	// no name found, return empty string
		}
	}

	size_t cchw = (unsigned(lSize) / sizeof(utf16));
	utf16 * pchwName = new utf16[cchw+1]; // lSize - byte count for Uni str
	const utf16 * pchwSrcName = reinterpret_cast<const utf16*>(pNameTbl + lOffset);

//	if (ppec->cbBytesPerChar == sizeof(utf16))
//	{
		utf16ncpy(pchwName, pchwSrcName, cchw);
		TtfUtil::SwapWString(pchwName, cchw); // make big endian
//	}
//	else
//	{
//		// TODO: properly handle Macintosh encoding
//		Platform_UnicodeToANSI((utf16 *)pbStr, cchwStr, (char *)pbNextString, cchwStr);
//	}

///    std::transform(pchwSrcName, pchwSrcName + cchw, pchwName, std::ptr_fun<utf16,utf16>(lsbf));
	pchwName[cchw] = 0;  // zero terminate
	#ifdef _WIN32
		stuName.assign((const wchar_t*)pchwName, cchw);
	#else
		wchar_t * pchwName32 = new wchar_t[cchw+1]; // lSize - byte count for Uni str
		for (int i = 0; i <= signed(cchw); i++) {
			pchwName32[i] = pchwName[i];
		}
		stuName.assign(pchwName32, cchw);
		delete [] pchwName32;
	#endif

	return stuName;
}